

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

Vector __thiscall xt::vector::vec(vector *this,List *list)

{
  bool bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  bool bVar4;
  double __z;
  double __z_00;
  Vector VVar5;
  Object local_a0;
  shared_ptr<xt::_Vector> local_80;
  shared_ptr<xt::_Vector> local_70;
  undefined1 local_60 [8];
  List n;
  Object local_40;
  byte local_19;
  List *local_18;
  List *list_local;
  Vector *ret;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_18 = list;
  list_local = (List *)this;
  peVar2 = std::__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      list);
  if (peVar2->count == 0) {
    VVar5 = empty();
    _Var3 = VVar5.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    local_19 = 0;
    peVar2 = std::__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        list);
    Object::Object(&local_40,&peVar2->first);
    conj(this,__z);
    Object::~Object(&local_40);
    peVar2 = std::__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        list);
    std::shared_ptr<xt::_List>::shared_ptr((shared_ptr<xt::_List> *)local_60,&peVar2->rest);
    while( true ) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
      bVar4 = false;
      if (bVar1) {
        peVar2 = std::__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
        bVar4 = peVar2->count != 0;
      }
      if (!bVar4) break;
      std::shared_ptr<xt::_Vector>::shared_ptr(&local_80,(shared_ptr<xt::_Vector> *)this);
      peVar2 = std::__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_60);
      Object::Object(&local_a0,&peVar2->first);
      conj(__z_00);
      std::shared_ptr<xt::_Vector>::operator=((shared_ptr<xt::_Vector> *)this,&local_70);
      std::shared_ptr<xt::_Vector>::~shared_ptr(&local_70);
      Object::~Object(&local_a0);
      std::shared_ptr<xt::_Vector>::~shared_ptr(&local_80);
      peVar2 = std::__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_60);
      std::shared_ptr<xt::_List>::operator=((shared_ptr<xt::_List> *)local_60,&peVar2->rest);
    }
    local_19 = 1;
    std::shared_ptr<xt::_List>::~shared_ptr((shared_ptr<xt::_List> *)local_60);
    _Var3._M_pi = extraout_RDX;
    if ((local_19 & 1) == 0) {
      std::shared_ptr<xt::_Vector>::~shared_ptr((shared_ptr<xt::_Vector> *)this);
      _Var3._M_pi = extraout_RDX_00;
    }
  }
  VVar5.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  VVar5.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Vector)VVar5.super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Vector vec(List list) {
	if (list->count == 0) return empty();
	Vector ret = vector::conj(list->first);
	List n = list->rest;
	while (n && n->count) {
		ret = conj(ret, n->first);
		n = n->rest;
	}
	return ret;
	
}